

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O2

void __thiscall
enact::InterpolationExpr::InterpolationExpr
          (InterpolationExpr *this,
          unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *start,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *interpolated,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *end,Token *token)

{
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__InterpolationExpr_00124848;
  (this->start)._M_t.
  super___uniq_ptr_impl<enact::StringExpr,_std::default_delete<enact::StringExpr>_>._M_t.
  super__Tuple_impl<0UL,_enact::StringExpr_*,_std::default_delete<enact::StringExpr>_>.
  super__Head_base<0UL,_enact::StringExpr_*,_false>._M_head_impl =
       (start->_M_t).
       super___uniq_ptr_impl<enact::StringExpr,_std::default_delete<enact::StringExpr>_>._M_t.
       super__Tuple_impl<0UL,_enact::StringExpr_*,_std::default_delete<enact::StringExpr>_>.
       super__Head_base<0UL,_enact::StringExpr_*,_false>._M_head_impl;
  (start->_M_t).super___uniq_ptr_impl<enact::StringExpr,_std::default_delete<enact::StringExpr>_>.
  _M_t.super__Tuple_impl<0UL,_enact::StringExpr_*,_std::default_delete<enact::StringExpr>_>.
  super__Head_base<0UL,_enact::StringExpr_*,_false>._M_head_impl = (StringExpr *)0x0;
  (this->interpolated)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (interpolated->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (interpolated->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->end)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (end->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
       super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (end->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  Token::Token(&this->token,token);
  return;
}

Assistant:

InterpolationExpr(
                std::unique_ptr<StringExpr> start,
                std::unique_ptr<Expr> interpolated,
                std::unique_ptr<Expr> end,
                Token token) :
                start{std::move(start)},
                interpolated{std::move(interpolated)},
                end{std::move(end)},
                token{std::move(token)} {}